

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int32_t define_batches(PerfProfBatch *batches)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  char *local_3308;
  char *local_3300;
  int local_2afc;
  char local_2af8 [4];
  int32_t num_solvers_1;
  char dirpath_1 [2048];
  char batch_name_1 [256];
  int local_21ec;
  int32_t scale_factor_1;
  int32_t sidx_1;
  char *family_1;
  char *pcStack_21d8;
  int32_t fidx_1;
  char *local_21d0;
  char *local_21c8;
  char *local_19d0;
  char *local_19c8;
  char *local_19c0;
  char *local_11c8;
  char *local_11c0;
  int local_9bc;
  char local_9b8 [4];
  int32_t num_solvers;
  char dirpath [2048];
  char batch_name [256];
  int local_ac;
  int32_t scale_factor;
  int32_t sidx;
  char *family;
  int32_t fidx;
  int32_t SFACTORS [7];
  char *FAMILIES [5];
  char local_48 [8];
  char DIRPATH_FMT_TEMPLATE [47];
  int32_t num_batches;
  PerfProfBatch *batches_local;
  
  stack0xffffffffffffffec = 0;
  memcpy(local_48,"data/BAP_Instances/last-10/CVRP-scaled-%d.0/%s",0x2f);
  memcpy(SFACTORS + 6,&PTR_anon_var_dwarf_6e5_0011c4b0,0x28);
  SFACTORS[0] = 4;
  SFACTORS[1] = 5;
  SFACTORS[2] = 8;
  SFACTORS[3] = 10;
  SFACTORS[4] = 0x14;
  for (family._4_4_ = 0; family._4_4_ < 5; family._4_4_ = family._4_4_ + 1) {
    uVar2 = *(undefined8 *)(SFACTORS + (long)family._4_4_ * 2 + 6);
    for (local_ac = 0; local_ac < 7; local_ac = local_ac + 1) {
      uVar1 = SFACTORS[(long)local_ac + -2];
      if ((int)uVar1 < 5) {
        snprintf_safe(dirpath + 0x7f8,0x100,"Fractional-labeling-comparison-for-%s-scaled-%d.0",
                      uVar2,(ulong)uVar1);
        snprintf_safe(local_9b8,0x800,local_48,(ulong)uVar1,uVar2);
        if (stack0xffffffffffffffec < 0x800) {
          batches[stack0xffffffffffffffec].max_num_procs = 0xe;
          pcVar3 = strdup(dirpath + 0x7f8);
          batches[stack0xffffffffffffffec].name = pcVar3;
          batches[stack0xffffffffffffffec].timelimit = 60.0;
          batches[stack0xffffffffffffffec].nseeds = 1;
          pcVar3 = strdup(local_9b8);
          batches[stack0xffffffffffffffec].dirs[0] = pcVar3;
          batches[stack0xffffffffffffffec].dirs[1] = (char *)0x0;
          batches[stack0xffffffffffffffec].filter.family = (char *)0x0;
          batches[stack0xffffffffffffffec].filter.ncustomers.a = 0;
          batches[stack0xffffffffffffffec].filter.ncustomers.b = 99999;
          batches[stack0xffffffffffffffec].filter.nvehicles.a = 0;
          batches[stack0xffffffffffffffec].filter.nvehicles.b = 99999;
          lVar4 = (long)stack0xffffffffffffffec;
          local_9bc = 1;
          memset(&local_11c8,0,0x808);
          local_11c8 = "BAC MIP Pricer (EFL)";
          local_11c0 = "-DNUM_THREADS=1";
          memcpy(batches[lVar4].solvers,&local_11c8,0x808);
          lVar4 = (long)stack0xffffffffffffffec;
          lVar5 = (long)local_9bc;
          local_9bc = local_9bc + 1;
          memset(&local_19d0,0,0x808);
          local_19d0 = "BAC MIP Pricer (AFL)";
          local_19c8 = "-DAMORTIZED_FRACTIONAL_LABELING=1";
          local_19c0 = "-DNUM_THREADS=1";
          memcpy(batches[lVar4].solvers + lVar5,&local_19d0,0x808);
          lVar4 = (long)stack0xffffffffffffffec;
          lVar5 = (long)local_9bc;
          local_9bc = local_9bc + 1;
          memset(&stack0xffffffffffffde28,0,0x808);
          pcStack_21d8 = "BAC MIP Pricer (NFL)";
          local_21d0 = "-DDISABLE_FRACTIONAL_SEPARATION=1";
          local_21c8 = "-DNUM_THREADS=1";
          memcpy(batches[lVar4].solvers + lVar5,&stack0xffffffffffffde28,0x808);
        }
        stack0xffffffffffffffec = stack0xffffffffffffffec + 1;
      }
    }
  }
  for (family_1._4_4_ = 0; family_1._4_4_ < 5; family_1._4_4_ = family_1._4_4_ + 1) {
    uVar2 = *(undefined8 *)(SFACTORS + (long)family_1._4_4_ * 2 + 6);
    for (local_21ec = 0; local_21ec < 7; local_21ec = local_21ec + 1) {
      uVar1 = SFACTORS[(long)local_21ec + -2];
      if ((int)uVar1 < 0x15) {
        snprintf_safe(dirpath_1 + 0x7f8,0x100,"%s-scaled-%d.0",uVar2,(ulong)uVar1);
        snprintf_safe(local_2af8,0x800,local_48,(ulong)uVar1,uVar2);
        if (stack0xffffffffffffffec < 0x800) {
          batches[stack0xffffffffffffffec].max_num_procs = 1;
          pcVar3 = strdup(dirpath_1 + 0x7f8);
          batches[stack0xffffffffffffffec].name = pcVar3;
          batches[stack0xffffffffffffffec].timelimit = 10.0;
          batches[stack0xffffffffffffffec].nseeds = 1;
          pcVar3 = strdup(local_2af8);
          batches[stack0xffffffffffffffec].dirs[0] = pcVar3;
          batches[stack0xffffffffffffffec].dirs[1] = (char *)0x0;
          batches[stack0xffffffffffffffec].filter.family = (char *)0x0;
          batches[stack0xffffffffffffffec].filter.ncustomers.a = 0;
          batches[stack0xffffffffffffffec].filter.ncustomers.b = 99999;
          batches[stack0xffffffffffffffec].filter.nvehicles.a = 0;
          batches[stack0xffffffffffffffec].filter.nvehicles.b = 99999;
          lVar4 = (long)stack0xffffffffffffffec;
          local_2afc = 1;
          memset(&local_3308,0,0x808);
          local_3308 = "BAC MIP Pricer (AFL)";
          local_3300 = "-DAMORTIZED_FRACTIONAL_LABELING=1";
          memcpy(batches[lVar4].solvers,&local_3308,0x808);
          lVar4 = (long)local_2afc;
          local_2afc = local_2afc + 1;
          memcpy(batches[stack0xffffffffffffffec].solvers + lVar4,&BAPCOD_SOLVER,0x808);
        }
        stack0xffffffffffffffec = stack0xffffffffffffffec + 1;
      }
    }
  }
  return stack0xffffffffffffffec;
}

Assistant:

int32_t define_batches(PerfProfBatch *batches) {
    int32_t num_batches = 0;

    const char DIRPATH_FMT_TEMPLATE[] =
        "data/BAP_Instances/last-10/CVRP-scaled-%d.0/%s";
    const char *FAMILIES[] = {"A", "B", "F", "E", "P"};
    const int32_t SFACTORS[] = {1, 2, 4, 5, 8, 10, 20};

    //
    // Compare the EFL, AFL dual bounds on families E, F and scales {1, 2, 4}
    // with DEFAULT_TIME_LIMIT
    //
    {
        for (int32_t fidx = 0; fidx < ARRAY_LEN_i32(FAMILIES); fidx++) {

            const char *family = FAMILIES[fidx];

            for (int32_t sidx = 0; sidx < ARRAY_LEN_i32(SFACTORS); sidx++) {
                const int32_t scale_factor = SFACTORS[sidx];

                if (scale_factor > 4) {
                    continue;
                }

                char batch_name[256];
                char dirpath[2048];

                snprintf_safe(
                    batch_name, ARRAY_LEN(batch_name),
                    "Fractional-labeling-comparison-for-%s-scaled-%d.0", family,
                    scale_factor);

                snprintf_safe(dirpath, ARRAY_LEN(dirpath), DIRPATH_FMT_TEMPLATE,
                              scale_factor, family);

                if (num_batches < MAX_NUM_BATCHES) {
                    batches[num_batches].max_num_procs = 14;
                    batches[num_batches].name = strdup(batch_name);
                    batches[num_batches].timelimit = 60;
                    batches[num_batches].nseeds = 1;
                    batches[num_batches].dirs[0] = strdup(dirpath);
                    batches[num_batches].dirs[1] = NULL;
                    batches[num_batches].filter = DEFAULT_FILTER;

                    int32_t num_solvers = 0;
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (EFL)",
                                         {"-DNUM_THREADS=1"}};
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (AFL)",
                                         {"-DAMORTIZED_FRACTIONAL_LABELING=1",
                                          "-DNUM_THREADS=1"}};
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (NFL)",
                                         {"-DDISABLE_FRACTIONAL_SEPARATION=1",
                                          "-DNUM_THREADS=1"}};
                }
                ++num_batches;
            }
        }
    }

    //
    // Compare the BAC MIP Pricer (AFL) against BapCod with DEFAULT_TIME_LIMIT
    //
    {
        for (int32_t fidx = 0; fidx < ARRAY_LEN_i32(FAMILIES); fidx++) {

            const char *family = FAMILIES[fidx];
            for (int32_t sidx = 0; sidx < ARRAY_LEN_i32(SFACTORS); sidx++) {

                const int32_t scale_factor = SFACTORS[sidx];
                if (scale_factor > 20) {
                    continue;
                }

                char batch_name[256];
                char dirpath[2048];

                snprintf_safe(batch_name, ARRAY_LEN(batch_name),
                              "%s-scaled-%d.0", family, scale_factor);

                snprintf_safe(dirpath, ARRAY_LEN(dirpath), DIRPATH_FMT_TEMPLATE,
                              scale_factor, family);

                if (num_batches < MAX_NUM_BATCHES) {
                    batches[num_batches].max_num_procs = 1;
                    batches[num_batches].name = strdup(batch_name);
                    batches[num_batches].timelimit = DEFAULT_TIME_LIMIT;
                    batches[num_batches].nseeds = 1;
                    batches[num_batches].dirs[0] = strdup(dirpath);
                    batches[num_batches].dirs[1] = NULL;
                    batches[num_batches].filter = DEFAULT_FILTER;

                    int32_t num_solvers = 0;
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (AFL)",
                                         {"-DAMORTIZED_FRACTIONAL_LABELING=1"}};
                    batches[num_batches].solvers[num_solvers++] = BAPCOD_SOLVER;
                }
                ++num_batches;
            }
        }
    }

    return num_batches;
}